

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O0

void __thiscall
cfd::core::AbstractTransaction::AddScriptWitnessStack
          (AbstractTransaction *this,uint32_t tx_in_index,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  bool bVar1;
  size_type witness_len;
  undefined8 uVar2;
  undefined4 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  undefined8 in_stack_ffffffffffffff08;
  CfdError error_code;
  CfdException *in_stack_ffffffffffffff10;
  allocator local_c1;
  string local_c0 [32];
  CfdSourceLocation local_a0 [2];
  allocator local_59;
  undefined1 local_58 [8];
  string function_name;
  wally_tx_witness_stack *stack_pointer;
  bool is_alloc;
  wally_tx *pwStack_28;
  int ret;
  wally_tx *tx_pointer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data_local;
  AbstractTransaction *pAStack_10;
  uint32_t tx_in_index_local;
  AbstractTransaction *this_local;
  
  error_code = (CfdError)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  tx_pointer = (wally_tx *)data;
  data_local._4_4_ = tx_in_index;
  pAStack_10 = this;
  (*this->_vptr_AbstractTransaction[0xb])(this,(ulong)tx_in_index,0x1b2,"AddScriptWitnessStack");
  pwStack_28 = (wally_tx *)this->wally_tx_pointer_;
  if ((ulong)data_local._4_4_ < pwStack_28->num_inputs) {
    stack_pointer._4_4_ = 0;
    stack_pointer._3_1_ = 0;
    function_name.field_2._8_8_ = 0;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)local_58,"wally_tx_witness_stack_init_alloc",&local_59)
    ;
    ::std::allocator<char>::~allocator((allocator<char> *)&local_59);
    if (pwStack_28->inputs[data_local._4_4_].witness == (wally_tx_witness_stack *)0x0) {
      stack_pointer._3_1_ = 1;
      stack_pointer._4_4_ =
           wally_tx_witness_stack_init_alloc
                     (1,(wally_tx_witness_stack **)((long)&function_name.field_2 + 8));
    }
    else {
      function_name.field_2._8_8_ = pwStack_28->inputs[data_local._4_4_].witness;
    }
    if (stack_pointer._4_4_ == 0) {
      ::std::__cxx11::string::operator=((string *)local_58,"wally_tx_witness_stack_add");
      bVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)tx_pointer);
      if (bVar1) {
        stack_pointer._4_4_ =
             wally_tx_witness_stack_add
                       ((wally_tx_witness_stack *)function_name.field_2._8_8_,(uchar *)0x0,0);
      }
      else {
        uVar2 = function_name.field_2._8_8_;
        in_stack_ffffffffffffff10 =
             (CfdException *)
             ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)tx_pointer);
        witness_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)tx_pointer
                                );
        stack_pointer._4_4_ =
             wally_tx_witness_stack_add
                       ((wally_tx_witness_stack *)uVar2,(uchar *)in_stack_ffffffffffffff10,
                        witness_len);
        error_code = (CfdError)((ulong)uVar2 >> 0x20);
      }
      if (((stack_pointer._3_1_ & 1) != 0) && (stack_pointer._4_4_ == 0)) {
        ::std::__cxx11::string::operator=((string *)local_58,"wally_tx_set_input_witness");
        in_stack_ffffffffffffff04 =
             wally_tx_set_input_witness
                       (pwStack_28,(ulong)data_local._4_4_,
                        (wally_tx_witness_stack *)function_name.field_2._8_8_);
        stack_pointer._4_4_ = in_stack_ffffffffffffff04;
      }
      if (((stack_pointer._3_1_ & 1) != 0) && (function_name.field_2._8_8_ != 0)) {
        wally_tx_witness_stack_free((wally_tx_witness_stack *)function_name.field_2._8_8_);
      }
    }
    if (stack_pointer._4_4_ != 0) {
      local_a0[0].filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_transaction_common.cpp"
                   ,0x2f);
      local_a0[0].filename = local_a0[0].filename + 1;
      local_a0[0].line = 0x1e0;
      local_a0[0].funcname = "AddScriptWitnessStack";
      logger::warn<std::__cxx11::string&,int&>
                (local_a0,"{} NG[{}].",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 (int *)((long)&stack_pointer + 4));
      uVar2 = __cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_c0,"witness stack error.",&local_c1);
      CfdException::CfdException
                (in_stack_ffffffffffffff10,error_code,
                 (string *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::__cxx11::string::~string((string *)local_58);
  }
  return;
}

Assistant:

void AbstractTransaction::AddScriptWitnessStack(
    uint32_t tx_in_index, const std::vector<uint8_t> &data) {
  CheckTxInIndex(tx_in_index, __LINE__, __FUNCTION__);

  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  if (tx_pointer->num_inputs > tx_in_index) {
    int ret = WALLY_OK;
    bool is_alloc = false;
    struct wally_tx_witness_stack *stack_pointer = NULL;

    std::string function_name = "wally_tx_witness_stack_init_alloc";
    if (tx_pointer->inputs[tx_in_index].witness == NULL) {
      is_alloc = true;
      ret = wally_tx_witness_stack_init_alloc(1, &stack_pointer);
    } else {
      stack_pointer = tx_pointer->inputs[tx_in_index].witness;
    }

    if (ret == WALLY_OK) {
      try {
        // append witness stack
        function_name = "wally_tx_witness_stack_add";
        if (data.empty()) {
          ret = wally_tx_witness_stack_add(stack_pointer, NULL, 0);
        } else {
          ret = wally_tx_witness_stack_add(
              stack_pointer, data.data(), data.size());
        }

        // append tx input
        if (is_alloc && (ret == WALLY_OK)) {
          function_name = "wally_tx_set_input_witness";
          ret = wally_tx_set_input_witness(
              tx_pointer, tx_in_index, stack_pointer);
        }
      } catch (...) {
        // internal error.
        warn(CFD_LOG_SOURCE, "system error.");
        ret = WALLY_ERROR;
      }

      if (is_alloc && stack_pointer) {
        wally_tx_witness_stack_free(stack_pointer);
      }
    }

    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "{} NG[{}].", function_name, ret);
      throw CfdException(kCfdIllegalStateError, "witness stack error.");
    }
  }
}